

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enum_functions.cpp
# Opt level: O3

void duckdb::EnumLastFunction(DataChunk *input,ExpressionState *state,Vector *result)

{
  reference pvVar1;
  vector<duckdb::LogicalType,_true> types;
  Value val;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> vStack_68;
  Value local_50 [64];
  
  duckdb::DataChunk::GetTypes();
  pvVar1 = vector<duckdb::LogicalType,_true>::operator[]
                     ((vector<duckdb::LogicalType,_true> *)&vStack_68,0);
  duckdb::EnumType::GetSize(pvVar1);
  pvVar1 = vector<duckdb::LogicalType,_true>::operator[]
                     ((vector<duckdb::LogicalType,_true> *)&vStack_68,0);
  duckdb::EnumType::GetValuesInsertOrder(pvVar1);
  duckdb::Vector::GetValue((ulong)local_50);
  duckdb::Vector::Reference((Value *)result);
  duckdb::Value::~Value(local_50);
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&vStack_68);
  return;
}

Assistant:

static void EnumLastFunction(DataChunk &input, ExpressionState &state, Vector &result) {
	auto types = input.GetTypes();
	D_ASSERT(types.size() == 1);
	auto enum_size = EnumType::GetSize(types[0]);
	auto &enum_vector = EnumType::GetValuesInsertOrder(types[0]);
	auto val = Value(enum_vector.GetValue(enum_size - 1));
	result.Reference(val);
}